

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_shift_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  ulong arg2;
  TCGOpcode opc_00;
  TCGContext_conflict6 *tcg_ctx;
  uint arg2_00;
  TCGv_i32 ret;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  
  if (rt == 0) {
    return;
  }
  arg2_00 = (ushort)imm & 0x1f;
  arg2 = (ulong)arg2_00;
  pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)ctx);
  if (rs == 0) {
    opc_00 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_0097e0cb:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,opc_00,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != ret_00) {
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_0097e0cb;
  }
  if ((int)opc < 0x38) {
    if (opc == 0) {
      tcg_gen_shli_i64_mips64el((TCGContext_conflict6 *)ctx,ret_00,ret_00,arg2);
    }
    else {
      if (opc != 2) {
        if (opc != 3) goto switchD_0097e0fb_caseD_39;
        goto switchD_0097e0fb_caseD_3b;
      }
      if (arg2 != 0) {
        tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,ret_00,ret_00);
        pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
        goto LAB_0097e2da;
      }
    }
LAB_0097e2e1:
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2),ret_00);
    goto switchD_0097e0fb_caseD_39;
  }
  if (0x200001 < (int)opc) {
    if (opc != 0x200002) {
      if (opc == 0x20003a) {
        pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
        if ((imm & 0x1fU) == 0) {
          if (pTVar2 != ret_00) {
            tcg_gen_op2_mips64el
                      ((TCGContext_conflict6 *)ctx,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)ctx),
                       (TCGArg)pTVar1);
          }
          goto switchD_0097e0fb_caseD_39;
        }
      }
      else {
        if (opc != 0x20003e) goto switchD_0097e0fb_caseD_39;
        pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
        arg2_00 = arg2_00 | 0x20;
      }
      tcg_gen_rotri_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar2,ret_00,arg2_00);
      goto switchD_0097e0fb_caseD_39;
    }
    if (arg2 != 0) {
      pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I32,false);
      ret = (TCGv_i32)((long)pTVar1 - (long)ctx);
      tcg_gen_extrl_i64_i32_mips64el((TCGContext_conflict6 *)ctx,ret,ret_00);
      tcg_gen_rotri_i32_mips64el((TCGContext_conflict6 *)ctx,ret,ret,arg2_00);
      tcg_gen_ext_i32_i64_mips64el
                ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2),ret);
      tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,pTVar1);
      goto switchD_0097e0fb_caseD_39;
    }
    goto LAB_0097e2e1;
  }
  switch(opc) {
  case 0x38:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    break;
  default:
    goto switchD_0097e0fb_caseD_39;
  case 0x3a:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    goto LAB_0097e2da;
  case 0x3b:
switchD_0097e0fb_caseD_3b:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    goto LAB_0097e1e5;
  case 0x3c:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    arg2 = arg2 + 0x20;
    break;
  case 0x3e:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    arg2 = arg2 + 0x20;
LAB_0097e2da:
    tcg_gen_shri_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar2,ret_00,arg2);
    goto switchD_0097e0fb_caseD_39;
  case 0x3f:
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2);
    arg2 = arg2 + 0x20;
LAB_0097e1e5:
    tcg_gen_sari_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar2,ret_00,arg2);
    goto switchD_0097e0fb_caseD_39;
  }
  tcg_gen_shli_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar2,ret_00,arg2);
switchD_0097e0fb_caseD_39:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(ret_00 + (long)ctx));
  return;
}

Assistant:

static void gen_shift_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = ((uint16_t)imm) & 0x1f;
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLL:
        tcg_gen_shli_tl(tcg_ctx, t0, t0, uimm);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        break;
    case OPC_SRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SRL:
        if (uimm != 0) {
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_ROTR:
        if (uimm != 0) {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
            tcg_gen_rotri_i32(tcg_ctx, t1, t1, uimm);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t1);
            tcg_temp_free_i32(tcg_ctx, t1);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLL:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRL:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DROTR:
        if (uimm != 0) {
            tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_DSLL32:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRA32:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRL32:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DROTR32:
        tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}